

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

TestVat * __thiscall capnp::_::anon_unknown_0::TestNetwork::add(TestNetwork *this,StringPtr name)

{
  StringPtr key;
  Entry *pEVar1;
  RefOrVoid<capnp::_::(anonymous_namespace)::TestVat> pTVar2;
  undefined1 local_48 [48];
  TestNetwork *this_local;
  StringPtr name_local;
  
  local_48._24_8_ = name.content.size_;
  local_48._16_8_ = name.content.ptr;
  local_48._40_8_ = this;
  this_local = (TestNetwork *)local_48._16_8_;
  name_local.content.ptr = (char *)local_48._24_8_;
  kj::
  heap<capnp::_::(anonymous_namespace)::TestVat,capnp::_::(anonymous_namespace)::TestNetwork&,kj::StringPtr&>
            ((kj *)local_48,this,(StringPtr *)&this_local);
  key.content.size_ = local_48._24_8_;
  key.content.ptr = (char *)local_48._16_8_;
  pEVar1 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>
           ::insert(&this->map,key,
                    (Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t> *)local_48);
  pTVar2 = kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::operator*
                     (&pEVar1->value);
  kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t> *)local_48);
  return pTVar2;
}

Assistant:

TestVat& TestNetwork::add(kj::StringPtr name) {
  return *map.insert(name, kj::heap<TestVat>(*this, name)).value;
}